

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O3

void __thiscall
spdlog::details::T_formatter<spdlog::details::scoped_padder>::format
          (T_formatter<spdlog::details::scoped_padder> *this,log_msg *param_1,tm *tm_time,
          memory_buf_t *dest)

{
  uint uVar1;
  format_handler<char> *pfVar2;
  size_t sVar3;
  byte bVar4;
  memory_buf_t *handler;
  buffer<char> *buf;
  ulong uVar5;
  basic_string_view<char> fmt;
  basic_string_view<char> fmt_00;
  basic_string_view<char> fmt_01;
  scoped_padder p;
  uint local_98 [6];
  scoped_padder local_80;
  char *local_58;
  undefined8 local_50;
  undefined4 local_48;
  memory_buf_t *local_40;
  undefined8 local_38;
  undefined1 *local_30;
  undefined8 local_28;
  
  handler = dest;
  scoped_padder::scoped_padder(&local_80,8,&(this->super_flag_formatter).padinfo_,dest);
  uVar1 = tm_time->tm_hour;
  if (uVar1 < 100) {
    sVar3 = (dest->super_buffer<char>).size_;
    uVar5 = sVar3 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar5) {
      (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar5);
      sVar3 = (dest->super_buffer<char>).size_;
      uVar5 = sVar3 + 1;
    }
    bVar4 = (byte)((uVar1 & 0xff) / 10);
    (dest->super_buffer<char>).size_ = uVar5;
    (dest->super_buffer<char>).ptr_[sVar3] = bVar4 | 0x30;
    sVar3 = (dest->super_buffer<char>).size_;
    uVar5 = sVar3 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar5) {
      (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar5);
      sVar3 = (dest->super_buffer<char>).size_;
      uVar5 = sVar3 + 1;
    }
    (dest->super_buffer<char>).size_ = uVar5;
    (dest->super_buffer<char>).ptr_[sVar3] = (char)uVar1 + bVar4 * -10 | 0x30;
  }
  else {
    local_58 = "{:02}";
    local_50 = 5;
    local_48 = 0;
    local_38 = 1;
    local_28 = 0;
    fmt.size_ = (size_t)&local_58;
    fmt.data_ = (char *)0x5;
    local_98[0] = uVar1;
    local_40 = dest;
    local_30 = (undefined1 *)local_98;
    ::fmt::v11::detail::parse_format_string<char,fmt::v11::detail::format_handler<char>>
              ((detail *)"{:02}",fmt,(format_handler<char> *)handler);
  }
  sVar3 = (dest->super_buffer<char>).size_;
  uVar5 = sVar3 + 1;
  if ((dest->super_buffer<char>).capacity_ < uVar5) {
    (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar5);
    sVar3 = (dest->super_buffer<char>).size_;
    uVar5 = sVar3 + 1;
  }
  pfVar2 = (format_handler<char> *)(dest->super_buffer<char>).ptr_;
  (dest->super_buffer<char>).size_ = uVar5;
  *(undefined1 *)((long)&(pfVar2->parse_ctx).fmt_.data_ + sVar3) = 0x3a;
  uVar1 = tm_time->tm_min;
  if (uVar1 < 100) {
    sVar3 = (dest->super_buffer<char>).size_;
    uVar5 = sVar3 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar5) {
      (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar5);
      sVar3 = (dest->super_buffer<char>).size_;
      uVar5 = sVar3 + 1;
    }
    bVar4 = (byte)((uVar1 & 0xff) / 10);
    (dest->super_buffer<char>).size_ = uVar5;
    (dest->super_buffer<char>).ptr_[sVar3] = bVar4 | 0x30;
    sVar3 = (dest->super_buffer<char>).size_;
    uVar5 = sVar3 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar5) {
      (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar5);
      sVar3 = (dest->super_buffer<char>).size_;
      uVar5 = sVar3 + 1;
    }
    (dest->super_buffer<char>).size_ = uVar5;
    (dest->super_buffer<char>).ptr_[sVar3] = (char)uVar1 + bVar4 * -10 | 0x30;
  }
  else {
    local_58 = "{:02}";
    local_50 = 5;
    local_48 = 0;
    local_38 = 1;
    local_28 = 0;
    fmt_00.size_ = (size_t)&local_58;
    fmt_00.data_ = (char *)0x5;
    local_98[0] = uVar1;
    local_40 = dest;
    local_30 = (undefined1 *)local_98;
    ::fmt::v11::detail::parse_format_string<char,fmt::v11::detail::format_handler<char>>
              ((detail *)"{:02}",fmt_00,pfVar2);
  }
  sVar3 = (dest->super_buffer<char>).size_;
  uVar5 = sVar3 + 1;
  if ((dest->super_buffer<char>).capacity_ < uVar5) {
    (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar5);
    sVar3 = (dest->super_buffer<char>).size_;
    uVar5 = sVar3 + 1;
  }
  pfVar2 = (format_handler<char> *)(dest->super_buffer<char>).ptr_;
  (dest->super_buffer<char>).size_ = uVar5;
  *(undefined1 *)((long)&(pfVar2->parse_ctx).fmt_.data_ + sVar3) = 0x3a;
  uVar1 = tm_time->tm_sec;
  if (uVar1 < 100) {
    sVar3 = (dest->super_buffer<char>).size_;
    uVar5 = sVar3 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar5) {
      (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar5);
      sVar3 = (dest->super_buffer<char>).size_;
      uVar5 = sVar3 + 1;
    }
    bVar4 = (byte)((uVar1 & 0xff) / 10);
    (dest->super_buffer<char>).size_ = uVar5;
    (dest->super_buffer<char>).ptr_[sVar3] = bVar4 | 0x30;
    sVar3 = (dest->super_buffer<char>).size_;
    uVar5 = sVar3 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar5) {
      (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar5);
      sVar3 = (dest->super_buffer<char>).size_;
      uVar5 = sVar3 + 1;
    }
    (dest->super_buffer<char>).size_ = uVar5;
    (dest->super_buffer<char>).ptr_[sVar3] = (char)uVar1 + bVar4 * -10 | 0x30;
  }
  else {
    local_58 = "{:02}";
    local_50 = 5;
    local_48 = 0;
    local_38 = 1;
    local_28 = 0;
    fmt_01.size_ = (size_t)&local_58;
    fmt_01.data_ = (char *)0x5;
    local_98[0] = uVar1;
    local_40 = dest;
    local_30 = (undefined1 *)local_98;
    ::fmt::v11::detail::parse_format_string<char,fmt::v11::detail::format_handler<char>>
              ((detail *)"{:02}",fmt_01,pfVar2);
  }
  scoped_padder::~scoped_padder(&local_80);
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, memory_buf_t &dest) override {
        const size_t field_size = 8;
        ScopedPadder p(field_size, padinfo_, dest);

        fmt_helper::pad2(tm_time.tm_hour, dest);
        dest.push_back(':');
        fmt_helper::pad2(tm_time.tm_min, dest);
        dest.push_back(':');
        fmt_helper::pad2(tm_time.tm_sec, dest);
    }